

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O0

void __thiscall xercesc_4_0::NamespaceScope::expandMap(NamespaceScope *this,StackElem *toExpand)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint local_34;
  PrefMapElem *newMap;
  uint newCapacity;
  uint oldCap;
  StackElem *toExpand_local;
  NamespaceScope *this_local;
  
  uVar1 = toExpand->fMapCapacity;
  if (uVar1 == 0) {
    local_34 = 0x10;
  }
  else {
    local_34 = (uint)(long)((double)uVar1 * 1.25);
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,(ulong)local_34 << 3)
  ;
  memcpy((PrefMapElem *)CONCAT44(extraout_var,iVar2),toExpand->fMap,(ulong)uVar1 << 3);
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,toExpand->fMap);
  toExpand->fMap = (PrefMapElem *)CONCAT44(extraout_var,iVar2);
  toExpand->fMapCapacity = local_34;
  return;
}

Assistant:

void NamespaceScope::expandMap(StackElem* const toExpand)
{
    // For convenience get the old map size
    const unsigned int oldCap = toExpand->fMapCapacity;

    //
    //  Expand the capacity by 25%, or initialize it to 16 if its currently
    //  empty. Then allocate a new temp buffer.
    //
    const unsigned int newCapacity = oldCap ?
                                     (unsigned int)(oldCap * 1.25) : 16;
    PrefMapElem* newMap = (PrefMapElem*) fMemoryManager->allocate
    (
        newCapacity * sizeof(PrefMapElem)
    );//new PrefMapElem[newCapacity];

    //
    //  Copy over the old stuff. We DON'T have to zero out the new stuff
    //  since this is a by value map and the current map index controls what
    //  is relevant.
    //
    memcpy(newMap, toExpand->fMap, oldCap * sizeof(PrefMapElem));

    // Delete the old map and store the new stuff
    fMemoryManager->deallocate(toExpand->fMap);//delete [] toExpand->fMap;
    toExpand->fMap = newMap;
    toExpand->fMapCapacity = newCapacity;
}